

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::capsule::capsule(capsule *this,void *value,_func_void_void_ptr *destructor)

{
  _func_void_void_ptr *p_Var1;
  int iVar2;
  _func_void_PyObject_ptr *p_Var3;
  PyObject *pPVar4;
  _lambda__object___1_ local_21;
  _func_void_void_ptr *local_20;
  _func_void_void_ptr *destructor_local;
  void *value_local;
  capsule *this_local;
  
  local_20 = destructor;
  destructor_local = (_func_void_void_ptr *)value;
  value_local = this;
  object::object(&this->super_object);
  p_Var1 = destructor_local;
  p_Var3 = capsule(void_const*,void(*)(void*))::{lambda(_object*)#1}::
           operator_cast_to_function_pointer(&local_21);
  pPVar4 = (PyObject *)PyCapsule_New(p_Var1,0,p_Var3);
  (this->super_object).super_handle.m_ptr = pPVar4;
  if ((this->super_object).super_handle.m_ptr == (PyObject *)0x0) {
    pybind11_fail("Could not allocate capsule object!");
  }
  iVar2 = PyCapsule_SetContext((this->super_object).super_handle.m_ptr,local_20);
  if (iVar2 != 0) {
    pybind11_fail("Could not set capsule context!");
  }
  return;
}

Assistant:

capsule(const void *value, void (*destructor)(void *)) {
        m_ptr = PyCapsule_New(const_cast<void *>(value), nullptr, [](PyObject *o) {
            auto destructor = reinterpret_cast<void (*)(void *)>(PyCapsule_GetContext(o));
            void *ptr = PyCapsule_GetPointer(o, nullptr);
            destructor(ptr);
        });

        if (!m_ptr)
            pybind11_fail("Could not allocate capsule object!");

        if (PyCapsule_SetContext(m_ptr, (void *) destructor) != 0)
            pybind11_fail("Could not set capsule context!");
    }